

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

float32 __thiscall rw::Matrix::identityError(Matrix *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float32 fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar8 = (float)(this->right).x + -1.0;
  fVar5 = (float)(this->right).y;
  fVar6 = (float)(this->right).z;
  fVar9 = (float)(this->up).y + -1.0;
  fVar1 = (float)(this->at).x;
  fVar2 = (float)(this->at).y;
  fVar10 = (float)(this->at).z + -1.0;
  fVar3 = (float)(this->up).x;
  fVar4 = (float)(this->up).z;
  fVar7 = dot(&this->pos,&this->pos);
  return (float32)((float)fVar7 +
                  fVar10 * fVar10 + fVar1 * fVar1 + fVar2 * fVar2 +
                  fVar4 * fVar4 + fVar3 * fVar3 + fVar9 * fVar9 +
                  fVar6 * fVar6 + fVar8 * fVar8 + fVar5 * fVar5);
}

Assistant:

float32
Matrix::identityError(void)
{
	V3d r = { right.x-1.0f, right.y, right.z };
	V3d u = { up.x, up.y-1.0f, up.z };
	V3d a = { at.x, at.y, at.z-1.0f };
	return dot(r,r) + dot(u,u) + dot(a,a) + dot(pos,pos);
}